

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_appender.cpp
# Opt level: O2

ArrowArray * __thiscall
duckdb::ArrowAppender::Finalize(ArrowArray *__return_storage_ptr__,ArrowAppender *this)

{
  templated_unique_single_t tVar1;
  type data;
  pointer pAVar2;
  long lVar3;
  reference type;
  reference pvVar4;
  ArrowArray *pAVar5;
  reference pvVar6;
  ulong __n;
  byte bVar7;
  templated_unique_single_t root_holder;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_38;
  
  bVar7 = 0;
  make_uniq<duckdb::ArrowAppendData,duckdb::ClientProperties&>
            ((duckdb *)&root_holder,&this->options);
  data = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
         operator*(&root_holder);
  AddChildren(data,((long)(this->types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pAVar2 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->(&root_holder);
  __return_storage_ptr__->children =
       (pAVar2->child_pointers).super_vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>.
       super__Vector_base<ArrowArray_*,_std::allocator<ArrowArray_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                    (((long)(this->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  __return_storage_ptr__->n_children = lVar3;
  lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(this->row_count);
  __return_storage_ptr__->length = lVar3;
  __return_storage_ptr__->n_buffers = 1;
  pAVar2 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->(&root_holder);
  __return_storage_ptr__->buffers = (pAVar2->buffers)._M_elems;
  __return_storage_ptr__->dictionary = (ArrowArray *)0x0;
  __return_storage_ptr__->null_count = 0;
  __return_storage_ptr__->offset = 0;
  pAVar2 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->(&root_holder);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ::_M_move_assign(&(pAVar2->child_data).
                    super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                   ,&this->root_data);
  __n = 0;
  while( true ) {
    pAVar2 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
             ::operator->(&root_holder);
    tVar1 = root_holder;
    if ((ulong)((long)(pAVar2->child_data).
                      super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pAVar2->child_data).
                      super_vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
    type = vector<duckdb::LogicalType,_true>::get<true>(&this->types,__n);
    pAVar2 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
             ::operator->(&root_holder);
    pvVar4 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
             ::get<true>(&pAVar2->child_data,__n);
    local_38._M_head_impl =
         (pvVar4->
         super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
         .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
    (pvVar4->
    super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)._M_t.
    super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
    .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
    pAVar5 = FinalizeChild(type,(unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                                 *)&local_38);
    pAVar2 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
             ::operator->(&root_holder);
    pvVar6 = vector<ArrowArray,_true>::get<true>(&pAVar2->child_arrays,__n);
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pvVar6->length = pAVar5->length;
      pAVar5 = (ArrowArray *)((long)pAVar5 + (ulong)bVar7 * -0x10 + 8);
      pvVar6 = (reference)((long)pvVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
    ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
                 *)&local_38);
    __n = __n + 1;
  }
  root_holder.
  super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
       (__uniq_ptr_data<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true,_true>
        )0x0;
  __return_storage_ptr__->private_data =
       (void *)tVar1.
               super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
               .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  __return_storage_ptr__->release = ReleaseArray;
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr(&root_holder.
               super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
             );
  return __return_storage_ptr__;
}

Assistant:

ArrowArray ArrowAppender::Finalize() {
	D_ASSERT(root_data.size() == types.size());
	auto root_holder = make_uniq<ArrowAppendData>(options);

	ArrowArray result;
	AddChildren(*root_holder, types.size());
	result.children = root_holder->child_pointers.data();
	result.n_children = NumericCast<int64_t>(types.size());

	// Configure root array
	result.length = NumericCast<int64_t>(row_count);
	result.n_buffers = 1;
	result.buffers = root_holder->buffers.data(); // there is no actual buffer there since we don't have NULLs
	result.offset = 0;
	result.null_count = 0; // needs to be 0
	result.dictionary = nullptr;
	root_holder->child_data = std::move(root_data);

	for (idx_t i = 0; i < root_holder->child_data.size(); i++) {
		root_holder->child_arrays[i] = *ArrowAppender::FinalizeChild(types[i], std::move(root_holder->child_data[i]));
	}

	// Release ownership to caller
	result.private_data = root_holder.release();
	result.release = ArrowAppender::ReleaseArray;
	return result;
}